

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkFree(Wlc_Ntk_t *p)

{
  Wlc_Ntk_t *p_local;
  
  if (p->pManName != (Abc_Nam_t *)0x0) {
    Abc_NamStop(p->pManName);
  }
  if (p->pMemFanin != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemFanin,0);
  }
  if (p->pMemTable != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemTable,0);
  }
  Vec_PtrFreeP(&p->vTables);
  if ((p->vPis).pArray != (int *)0x0) {
    free((p->vPis).pArray);
    (p->vPis).pArray = (int *)0x0;
  }
  if ((p->vPos).pArray != (int *)0x0) {
    free((p->vPos).pArray);
    (p->vPos).pArray = (int *)0x0;
  }
  if ((p->vCis).pArray != (int *)0x0) {
    free((p->vCis).pArray);
    (p->vCis).pArray = (int *)0x0;
  }
  if ((p->vCos).pArray != (int *)0x0) {
    free((p->vCos).pArray);
    (p->vCos).pArray = (int *)0x0;
  }
  if ((p->vFfs).pArray != (int *)0x0) {
    free((p->vFfs).pArray);
    (p->vFfs).pArray = (int *)0x0;
  }
  Vec_IntFreeP(&p->vInits);
  if ((p->vTravIds).pArray != (int *)0x0) {
    free((p->vTravIds).pArray);
    (p->vTravIds).pArray = (int *)0x0;
  }
  if ((p->vNameIds).pArray != (int *)0x0) {
    free((p->vNameIds).pArray);
    (p->vNameIds).pArray = (int *)0x0;
  }
  if ((p->vValues).pArray != (int *)0x0) {
    free((p->vValues).pArray);
    (p->vValues).pArray = (int *)0x0;
  }
  if ((p->vCopies).pArray != (int *)0x0) {
    free((p->vCopies).pArray);
    (p->vCopies).pArray = (int *)0x0;
  }
  if ((p->vBits).pArray != (int *)0x0) {
    free((p->vBits).pArray);
    (p->vBits).pArray = (int *)0x0;
  }
  if (p->pInits != (char *)0x0) {
    free(p->pInits);
    p->pInits = (char *)0x0;
  }
  if (p->pObjs != (Wlc_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Wlc_Obj_t *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p != (Wlc_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Wlc_NtkFree( Wlc_Ntk_t * p )
{
    if ( p->pManName )
        Abc_NamStop( p->pManName );
    if ( p->pMemFanin )
        Mem_FlexStop( p->pMemFanin, 0 );
    if ( p->pMemTable )
        Mem_FlexStop( p->pMemTable, 0 );
    Vec_PtrFreeP( &p->vTables );
    ABC_FREE( p->vPis.pArray );
    ABC_FREE( p->vPos.pArray );
    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->vFfs.pArray );
    Vec_IntFreeP( &p->vInits );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vNameIds.pArray );
    ABC_FREE( p->vValues.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vBits.pArray );
    ABC_FREE( p->pInits );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}